

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

LanczosSincFilter *
pbrt::LanczosSincFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  int freq;
  uintptr_t iptr;
  string local_48;
  Float local_24;
  float local_20;
  float local_1c;
  LanczosSincFilter *pLVar3;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"xradius","");
  local_1c = ParameterDictionary::GetOneFloat(parameters,&local_48,4.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"yradius","");
  local_20 = ParameterDictionary::GetOneFloat(parameters,&local_48,4.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"tau","");
  local_24 = ParameterDictionary::GetOneFloat(parameters,&local_48,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0xc0,8);
  pLVar3 = (LanczosSincFilter *)CONCAT44(extraout_var,iVar2);
  (pLVar3->radius).super_Tuple2<pbrt::Vector2,_float>.x = local_1c;
  (pLVar3->radius).super_Tuple2<pbrt::Vector2,_float>.y = local_20;
  pLVar3->tau = local_24;
  local_48._M_dataplus._M_p = (pointer)((ulong)pLVar3 | 0x4000000000000);
  FilterSampler::FilterSampler(&pLVar3->sampler,(FilterHandle *)&local_48,freq,alloc);
  return pLVar3;
}

Assistant:

LanczosSincFilter *LanczosSincFilter::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    Float xw = parameters.GetOneFloat("xradius", 4.);
    Float yw = parameters.GetOneFloat("yradius", 4.);
    Float tau = parameters.GetOneFloat("tau", 3.f);
    return alloc.new_object<LanczosSincFilter>(Vector2f(xw, yw), tau, alloc);
}